

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O0

void __thiscall libtorrent::http_stream::handshake2(http_stream *this,error_code *e,handler_type *h)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  char *pcVar5;
  http_stream *local_f8;
  code *local_f0;
  undefined8 local_e8;
  type local_e0;
  mutable_buffer local_a8;
  vector<char,_std::allocator<char>_> local_98;
  undefined1 local_80 [8];
  error_code ec_1;
  undefined1 local_58 [4];
  int code;
  error_code ec;
  char *status;
  size_type sStack_28;
  bool found_end;
  size_t read_pos;
  handler_type *h_local;
  error_code *e_local;
  http_stream *this_local;
  
  read_pos = (size_t)h;
  h_local = (handler_type *)e;
  e_local = (error_code *)this;
  bVar2 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar2) {
    sStack_28 = std::vector<char,_std::allocator<char>_>::size(&this->m_buffer);
    status._7_1_ = 0;
    if ((2 < sStack_28) &&
       (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,sStack_28 - 1)
       , *pvVar4 == '\n')) {
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_buffer,sStack_28 - 2);
      if (*pvVar4 == '\n') {
        status._7_1_ = 1;
      }
      else if ((((4 < sStack_28) &&
                (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                                    (&this->m_buffer,sStack_28 - 2), *pvVar4 == '\r')) &&
               (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                                   (&this->m_buffer,sStack_28 - 3), *pvVar4 == '\n')) &&
              (pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                                  (&this->m_buffer,sStack_28 - 4), *pvVar4 == '\r')) {
        status._7_1_ = 1;
      }
    }
    if ((status._7_1_ & 1) == 0) {
      std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,sStack_28 + 1);
      pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->m_buffer);
      local_a8 = (mutable_buffer)boost::asio::buffer(pcVar5 + sStack_28,1);
      local_f0 = handshake2;
      local_e8 = 0;
      local_f8 = this;
      std::
      bind<void(libtorrent::http_stream::*)(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&),libtorrent::http_stream*,std::_Placeholder<1>const&,std::function<void(boost::system::error_code_const&)>>
                (&local_e0,(offset_in_http_stream_to_subr *)&local_f0,&local_f8,
                 (_Placeholder<1> *)&std::placeholders::_1,
                 (function<void_(const_boost::system::error_code_&)> *)read_pos);
      boost::asio::
      async_read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,std::function<void(boost::system::error_code_const&)>&)>>
                ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *)this,(mutable_buffers_1 *)&local_a8,&local_e0,(type *)0x0);
      std::
      _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
      ::~_Bind(&local_e0);
    }
    else {
      status._6_1_ = 0;
      std::vector<char,_std::allocator<char>_>::push_back
                (&this->m_buffer,(value_type *)((long)&status + 6));
      pcVar5 = std::vector<char,_std::allocator<char>_>::data(&this->m_buffer);
      pcVar5 = strchr(pcVar5,0x20);
      sVar1 = read_pos;
      if (pcVar5 == (char *)0x0) {
        boost::system::error_code::error_code<boost::asio::error::basic_errors>
                  ((error_code *)&ec.cat_,operation_not_supported,(type *)0x0);
        std::function<void_(const_boost::system::error_code_&)>::operator()
                  ((function<void_(const_boost::system::error_code_&)> *)sVar1,
                   (error_code *)&ec.cat_);
        boost::system::error_code::error_code((error_code *)local_58);
        close(this,(int)local_58);
      }
      else {
        iVar3 = atoi(pcVar5 + 1);
        sVar1 = read_pos;
        if (iVar3 == 200) {
          std::function<void_(const_boost::system::error_code_&)>::operator()
                    ((function<void_(const_boost::system::error_code_&)> *)read_pos,
                     (error_code *)h_local);
          memset(&local_98,0,0x18);
          std::vector<char,_std::allocator<char>_>::vector(&local_98);
          std::vector<char,_std::allocator<char>_>::swap(&local_98,&this->m_buffer);
          std::vector<char,_std::allocator<char>_>::~vector(&local_98);
        }
        else {
          boost::system::error_code::error_code<boost::asio::error::basic_errors>
                    ((error_code *)&ec_1.cat_,operation_not_supported,(type *)0x0);
          std::function<void_(const_boost::system::error_code_&)>::operator()
                    ((function<void_(const_boost::system::error_code_&)> *)sVar1,
                     (error_code *)&ec_1.cat_);
          boost::system::error_code::error_code((error_code *)local_80);
          close(this,(int)local_80);
        }
      }
    }
  }
  return;
}

Assistant:

void http_stream::handshake2(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		std::size_t const read_pos = m_buffer.size();
		// look for \n\n and \r\n\r\n
		// both of which means end of http response header
		bool found_end = false;
		if (read_pos > 2 && m_buffer[read_pos - 1] == '\n')
		{
			if (m_buffer[read_pos - 2] == '\n')
			{
				found_end = true;
			}
			else if (read_pos > 4
				&& m_buffer[read_pos - 2] == '\r'
				&& m_buffer[read_pos - 3] == '\n'
				&& m_buffer[read_pos - 4] == '\r')
			{
				found_end = true;
			}
		}

		if (found_end)
		{
			m_buffer.push_back(0);
			char const* status = std::strchr(m_buffer.data(), ' ');
			if (status == nullptr)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			status++;
			int const code = std::atoi(status);
			if (code != 200)
			{
				h(boost::asio::error::operation_not_supported);
				error_code ec;
				close(ec);
				return;
			}

			h(e);
			std::vector<char>().swap(m_buffer);
			return;
		}

		// read another byte from the socket
		m_buffer.resize(read_pos + 1);
		async_read(m_sock, boost::asio::buffer(m_buffer.data() + read_pos, 1)
			, std::bind(&http_stream::handshake2, this, _1, std::move(h)));
	}